

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# legacy.c
# Opt level: O3

Class objc_upgrade_class(objc_class_gsv1 *oldClass)

{
  char cVar1;
  int iVar2;
  objc_ivar_list_gcc *poVar3;
  objc_ivar_list_gcc type;
  int *piVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  Class aClass;
  objc_ivar_list *poVar8;
  objc_ivar_list_gcc *poVar9;
  size_t sVar10;
  objc_method_list *poVar11;
  objc_property_list *poVar12;
  Class poVar13;
  uint uVar14;
  uint uVar15;
  objc_ivar_list_gcc *poVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  
  aClass = (Class)calloc(0x88,1);
  aClass->isa = oldClass->isa;
  aClass->name = oldClass->name;
  aClass->version = oldClass->version;
  aClass->info = 1;
  aClass->instance_size = oldClass->instance_size;
  poVar3 = oldClass->ivars;
  if (poVar3 == (objc_ivar_list_gcc *)0x0) {
    poVar8 = (objc_ivar_list *)0x0;
  }
  else {
    iVar19 = poVar3->count;
    lVar22 = (long)iVar19;
    poVar8 = (objc_ivar_list *)calloc(1,lVar22 << 5 | 0x10);
    poVar8->size = 0x20;
    poVar8->count = iVar19;
    if (0 < lVar22) {
      poVar16 = poVar3 + 9;
      iVar19 = -2;
      uVar17 = 0;
      do {
        uVar18 = uVar17 + 1;
        iVar21 = (int)lVar22;
        iVar2 = poVar3[uVar17 * 3 + 3].count;
        uVar5 = (uint)uVar17;
        if ((long)uVar18 < (long)iVar21) {
          iVar20 = poVar3[uVar18 * 3 + 3].count;
          if (iVar2 != iVar20) goto LAB_00117d54;
          if ((int)(uVar5 + 2) < iVar21) {
            iVar21 = iVar21 + iVar19;
            poVar9 = poVar16;
            do {
              if (poVar9->count != iVar2) {
                iVar21 = poVar9->count - iVar2;
                if (iVar21 != 0) goto LAB_00117d66;
                break;
              }
              poVar9 = poVar9 + 3;
              iVar21 = iVar21 + -1;
            } while (iVar21 != 0);
          }
          iVar21 = (int)oldClass->instance_size - iVar2;
LAB_00117d66:
          bVar7 = false;
          iVar20 = iVar2;
        }
        else {
          iVar20 = (int)oldClass->instance_size;
LAB_00117d54:
          iVar21 = 0;
          bVar7 = true;
        }
        iVar6 = -iVar20;
        if (0 < iVar20) {
          iVar6 = iVar20;
        }
        type = poVar3[uVar17 * 3 + 2];
        iVar20 = iVar6 - iVar2;
        *(objc_ivar_list_gcc *)(poVar8 + uVar17 * 2 + 1) = poVar3[uVar17 * 3 + 1];
        if (bVar7) {
          iVar21 = iVar20;
        }
        poVar8[uVar17 * 2 + 1].size = (size_t)type;
        *(int *)&poVar8[uVar17 * 2 + 2].size = iVar21;
        if ((oldClass->info & 0x10) == 0) {
          poVar9 = poVar3 + uVar17 * 3 + 3;
        }
        else {
          poVar9 = (objc_ivar_list_gcc *)oldClass->ivar_offsets[uVar17];
        }
        *(objc_ivar_list_gcc **)(poVar8 + uVar17 * 2 + 2) = poVar9;
        if (type == (objc_ivar_list_gcc)0x0) {
          uVar15 = 0x18;
LAB_00117e33:
          uVar15 = *(uint *)((long)&poVar8[uVar17 * 2 + 2].size + 4) & 0xfffffe07 | uVar15;
          cVar1 = *(char *)type;
          *(uint *)((long)&poVar8[uVar17 * 2 + 2].size + 4) = uVar15;
          if (cVar1 == '\0') goto LAB_00117e6d;
        }
        else {
          if (*(char *)type != '\0') {
            sVar10 = objc_alignof_type((char *)type);
            lVar22 = 0x3f;
            if (sVar10 != 0) {
              for (; sVar10 >> lVar22 == 0; lVar22 = lVar22 + -1) {
              }
            }
            uVar15 = (int)lVar22 << 3;
            if (sVar10 == 0) {
              uVar15 = 0;
            }
            goto LAB_00117e33;
          }
          uVar15 = *(uint *)((long)&poVar8[uVar17 * 2 + 2].size + 4) & 0xfffffe07 | 0x18;
          *(uint *)((long)&poVar8[uVar17 * 2 + 2].size + 4) = uVar15;
LAB_00117e6d:
          lVar22 = 0x3f;
          if ((long)iVar20 != 0) {
            for (; (ulong)(long)iVar20 >> lVar22 == 0; lVar22 = lVar22 + -1) {
            }
          }
          uVar14 = (int)lVar22 << 3;
          if (iVar6 == iVar2) {
            uVar14 = 0;
          }
          uVar15 = uVar15 & 0xfffffe07 | uVar14;
          *(uint *)((long)&poVar8[uVar17 * 2 + 2].size + 4) = uVar15;
        }
        if (((oldClass->info & 0x10) == 0) || ((int)oldClass->abi_version + 1 < 2)) {
          uVar14 = 3;
        }
        else {
          piVar4 = (int *)oldClass->strong_pointers;
          if (((ulong)piVar4 & 1) == 0) {
            if (((ulong)(long)*piVar4 <= uVar17 >> 5) ||
               (uVar14 = 1, ((uint)piVar4[(uVar17 >> 5) + 1] >> (uVar5 & 0x1f) & 1) == 0)) {
LAB_00117f23:
              piVar4 = (int *)oldClass->weak_pointers;
              if (((ulong)piVar4 & 1) == 0) {
                if (uVar17 >> 5 < (ulong)(long)*piVar4) {
                  uVar14 = 3;
                  if (((uint)piVar4[(uVar17 >> 5) + 1] >> (uVar5 & 0x1f) & 1) != 0)
                  goto LAB_00117f76;
                }
                else {
                  uVar14 = 3;
                }
              }
              else {
                uVar14 = 3;
                if (((long)(2 << ((byte)uVar17 & 0x1f)) & ~(ulong)piVar4) == 0) {
LAB_00117f76:
                  uVar14 = 2;
                }
              }
            }
          }
          else {
            uVar14 = 1;
            if (((long)(2 << ((byte)uVar17 & 0x1f)) & ~(ulong)piVar4) != 0) goto LAB_00117f23;
          }
        }
        *(uint *)((long)&poVar8[uVar17 * 2 + 2].size + 4) = uVar15 & 0xfffffffc | uVar14;
        lVar22 = (long)poVar3->count;
        iVar19 = iVar19 + -1;
        poVar16 = poVar16 + 3;
        uVar17 = uVar18;
      } while ((long)uVar18 < lVar22);
    }
  }
  aClass->ivars = poVar8;
  poVar11 = upgradeMethodList(oldClass->methods);
  aClass->methods = poVar11;
  aClass->protocols = oldClass->protocols;
  aClass->abi_version = oldClass->abi_version;
  poVar12 = upgradePropertyList(oldClass->properties);
  aClass->properties = poVar12;
  objc_register_selectors_from_class(aClass);
  if ((oldClass->info & 2) == 0) {
    aClass->info = 0;
    poVar13 = objc_upgrade_class((objc_class_gsv1 *)aClass->isa);
    aClass->isa = poVar13;
    objc_setAssociatedObject((id_conflict)aClass,&legacy_key,(id_conflict)oldClass,0);
  }
  else {
    aClass->instance_size = 0x88;
  }
  return aClass;
}

Assistant:

PRIVATE Class objc_upgrade_class(struct objc_class_gsv1 *oldClass)
{
	Class cls = calloc(sizeof(struct objc_class), 1);
	cls->isa = oldClass->isa;
	// super_class is left nil and we upgrade it later.
	cls->name = oldClass->name;
	cls->version = oldClass->version;
	cls->info = objc_class_flag_meta;
	cls->instance_size = oldClass->instance_size;
	cls->ivars = upgradeIvarList(oldClass);
	cls->methods = upgradeMethodList(oldClass->methods);
	cls->protocols = oldClass->protocols;
	cls->abi_version = oldClass->abi_version;
	cls->properties = upgradePropertyList(oldClass->properties);
	objc_register_selectors_from_class(cls);
	if (!objc_test_class_flag_gsv1(oldClass, objc_class_flag_meta_gsv1))
	{
		cls->info = 0;
		cls->isa = objc_upgrade_class((struct objc_class_gsv1*)cls->isa);
		objc_setAssociatedObject((id)cls, &legacy_key, (id)oldClass, OBJC_ASSOCIATION_ASSIGN);
	}
	else
	{
		cls->instance_size = sizeof(struct objc_class);
	}
	return cls;
}